

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesQueueBindSparseTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::sparse::anon_unknown_2::SparseQueueBindTestInstance::iterate
          (TestStatus *__return_storage_ptr__,SparseQueueBindTestInstance *this)

{
  DeviceDriver *vk;
  VkQueue pVVar1;
  bool bVar2;
  VkResult VVar3;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  Queue *pQVar4;
  NotSupportedError *this_00;
  deUint32 queueNdx;
  uint uVar5;
  int iVar6;
  deUint32 dVar7;
  char *msg;
  pointer pQVar8;
  allocator<char> local_2a1;
  Queue *local_2a0;
  vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
  queueSubmissions;
  vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
  signalSemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  allSemaphores;
  vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_> otherQueues;
  vector<unsigned_int,_std::allocator<unsigned_int>_> signalSemaphoresWaitDstStageMask;
  vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
  waitSemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  regularFences;
  QueueRequirementsVec requirements;
  VkBool32 local_108;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  bindSparseFences;
  RefBase<vk::Handle<(vk::HandleType)6>_> local_b0;
  RefBase<vk::Handle<(vk::HandleType)6>_> local_90;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_70;
  RefBase<vk::Handle<(vk::HandleType)4>_> local_50;
  
  vk_00 = Context::getInstanceInterface
                    ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  otherQueues.
  super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  otherQueues.
  super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  otherQueues.
  super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::vk::getPhysicalDeviceFeatures((VkPhysicalDeviceFeatures *)&requirements,vk_00,physicalDevice);
  if (local_108 == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Sparse binding not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesQueueBindSparseTests.cpp"
               ,0xa3);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  requirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  requirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  requirements.
  super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  allSemaphores.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000008;
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  emplace_back<vkt::sparse::QueueRequirements>(&requirements,(QueueRequirements *)&allSemaphores);
  allSemaphores.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)((ulong)(this->m_params).numQueues << 0x20);
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  emplace_back<vkt::sparse::QueueRequirements>(&requirements,(QueueRequirements *)&allSemaphores);
  SparseResourcesBaseInstance::createDeviceSupportingQueues
            (&this->super_SparseResourcesBaseInstance,&requirements);
  pQVar4 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,8,0);
  for (uVar5 = 0; uVar5 < (this->m_params).numQueues; uVar5 = uVar5 + 1) {
    allSemaphores.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)SparseResourcesBaseInstance::getQueue
                            (&this->super_SparseResourcesBaseInstance,0,uVar5);
    if (((Queue *)
        allSemaphores.
        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->queueHandle != pQVar4->queueHandle) {
      std::vector<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>::
      push_back(&otherQueues,(value_type *)&allSemaphores);
    }
  }
  local_2a0 = pQVar4;
  std::_Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
  ::~_Vector_base((_Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                   *)&requirements);
  vk = (this->super_SparseResourcesBaseInstance).m_deviceDriver.
       super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  allSemaphores.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  waitSemaphores.
  super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allSemaphores.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  allSemaphores.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  signalSemaphores.
  super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  waitSemaphores.
  super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  waitSemaphores.
  super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  signalSemaphoresWaitDstStageMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  signalSemaphores.
  super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  signalSemaphores.
  super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  queueSubmissions.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  signalSemaphoresWaitDstStageMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  signalSemaphoresWaitDstStageMask.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  queueSubmissions.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  queueSubmissions.
  super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar5 = 0; uVar5 < (this->m_params).numWaitSemaphores; uVar5 = uVar5 + 1) {
    ::vk::createSemaphore
              ((Move<vk::Handle<(vk::HandleType)4>_> *)&local_50,&vk->super_DeviceInterface,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,0,(VkAllocationCallbacks *)0x0);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)4>>
              ((sparse *)&requirements,(Move<vk::Handle<(vk::HandleType)4>_> *)&local_50);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>>>
                *)&allSemaphores,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_> *)&requirements);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::~SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_> *)&requirements);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_50);
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    push_back(&waitSemaphores,
              (value_type *)
              allSemaphores.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
  }
  for (uVar5 = 0; uVar5 < (this->m_params).numSignalSemaphores; uVar5 = uVar5 + 1) {
    ::vk::createSemaphore
              ((Move<vk::Handle<(vk::HandleType)4>_> *)&local_70,&vk->super_DeviceInterface,
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object,0,(VkAllocationCallbacks *)0x0);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)4>>
              ((sparse *)&requirements,(Move<vk::Handle<(vk::HandleType)4>_> *)&local_70);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>>>>>
                *)&allSemaphores,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_> *)&requirements);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>::~SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_> *)&requirements);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::~RefBase(&local_70);
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    push_back(&signalSemaphores,
              (value_type *)
              allSemaphores.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr);
    requirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(requirements.
                           super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x10000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&signalSemaphoresWaitDstStageMask,(uint *)&requirements);
  }
  iVar6 = (int)((ulong)((long)otherQueues.
                              super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)otherQueues.
                             super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1;
  dVar7 = (this->m_params).numWaitSemaphores;
  while( true ) {
    if ((dVar7 == 0) || (iVar6 == 0)) break;
    if (iVar6 == 1) {
      requirements.
      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)requirements.
                            super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                            ._M_impl.super__Vector_impl_data._M_finish._1_7_ << 8);
      requirements.
      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2a0;
      requirements.
      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(requirements.
                             super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,4);
      std::
      vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
      ::push_back(&queueSubmissions,(value_type *)&requirements);
      iVar6 = 0;
      dVar7 = 0;
    }
    else {
      dVar7 = dVar7 - 1;
      requirements.
      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)otherQueues.
                    super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar6 - 2];
      requirements.
      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)requirements.
                            super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                            ._M_impl.super__Vector_impl_data._M_finish._1_7_ << 8);
      requirements.
      super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(requirements.
                             super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,4);
      std::
      vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
      ::push_back(&queueSubmissions,(value_type *)&requirements);
      iVar6 = iVar6 + -1;
    }
  }
  if ((this->m_params).emptySubmission == false) {
    requirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(requirements.
                           super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                           ._M_impl.super__Vector_impl_data._M_finish._1_7_,1);
    requirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2a0;
    requirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(requirements.
                           super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,7);
    std::
    vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
    ::push_back(&queueSubmissions,(value_type *)&requirements);
  }
  else {
    requirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(requirements.
                           super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                           ._M_impl.super__Vector_impl_data._M_finish._1_7_,1);
    requirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2a0;
    requirements.
    super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(requirements.
                           super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,7);
    std::
    vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
    ::push_back(&queueSubmissions,(value_type *)&requirements);
  }
  if ((this->m_params).emptySubmission == false) {
    iVar6 = (int)((ulong)((long)otherQueues.
                                super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)otherQueues.
                               super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1;
    dVar7 = (this->m_params).numSignalSemaphores;
    while ((dVar7 != 0 && (iVar6 != 0))) {
      if (iVar6 == 1) {
        requirements.
        super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((ulong)requirements.
                              super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                              ._M_impl.super__Vector_impl_data._M_finish._1_7_ << 8);
        requirements.
        super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2a0;
        requirements.
        super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(requirements.
                               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,4);
        std::
        vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
        ::push_back(&queueSubmissions,(value_type *)&requirements);
        iVar6 = 0;
        dVar7 = 0;
      }
      else {
        dVar7 = dVar7 - 1;
        requirements.
        super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)otherQueues.
                      super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar6 - 2];
        requirements.
        super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((ulong)requirements.
                              super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                              ._M_impl.super__Vector_impl_data._M_finish._1_7_ << 8);
        requirements.
        super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(requirements.
                               super__Vector_base<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,4);
        std::
        vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
        ::push_back(&queueSubmissions,(value_type *)&requirements);
        iVar6 = iVar6 + -1;
      }
    }
  }
  regularFences.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  regularFences.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  regularFences.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bindSparseFences.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindSparseFences.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bindSparseFences.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (pQVar8 = queueSubmissions.
                super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pQVar8 != queueSubmissions.
                super__Vector_base<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
                ._M_impl.super__Vector_impl_data._M_finish; pQVar8 = pQVar8 + 1) {
    if (pQVar8->isSparseBinding == true) {
      if ((this->m_params).bindSparseUseFence == true) {
        ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_b0,
                          &vk->super_DeviceInterface,
                          (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                          super_RefBase<vk::VkDevice_s_*>.m_data.object,0,
                          (VkAllocationCallbacks *)0x0);
        makeVkSharedPtr<vk::Handle<(vk::HandleType)6>>
                  ((sparse *)&requirements,(Move<vk::Handle<(vk::HandleType)6>_> *)&local_b0);
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>>>
                    *)&bindSparseFences,
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> *)
                   &requirements);
        de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::release
                  ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> *)
                   &requirements);
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase(&local_b0);
      }
      pVVar1 = pQVar8->queue->queueHandle;
      if ((this->m_params).emptySubmission == true) {
        VVar3 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x11])(vk,pVVar1,0,0);
        iVar6 = 0x11d;
        msg = "vk.queueBindSparse(submissionIter->queue->queueHandle, 0u, DE_NULL, fence)";
      }
      else {
        VVar3 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x11])
                          (vk,pVVar1,1,&pQVar8->info);
        iVar6 = 0x11f;
        msg = 
        "vk.queueBindSparse(submissionIter->queue->queueHandle, 1u, &submissionIter->info.sparse, fence)"
        ;
      }
      ::vk::checkResult(VVar3,msg,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesQueueBindSparseTests.cpp"
                        ,iVar6);
    }
    else {
      ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_90,&vk->super_DeviceInterface
                        ,(this->super_SparseResourcesBaseInstance).m_logicalDevice.
                         super_RefBase<vk::VkDevice_s_*>.m_data.object,0,
                        (VkAllocationCallbacks *)0x0);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)6>>
                ((sparse *)&requirements,(Move<vk::Handle<(vk::HandleType)6>_> *)&local_90);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>>>>>
                  *)&regularFences,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> *)&requirements
                );
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>::release
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_> *)&requirements
                );
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase(&local_90);
      VVar3 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[2])
                        (vk,pQVar8->queue->queueHandle,1,&pQVar8->info);
      ::vk::checkResult(VVar3,
                        "vk.queueSubmit(submissionIter->queue->queueHandle, 1u, &submissionIter->info.regular, **regularFences.back())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesQueueBindSparseTests.cpp"
                        ,0x124);
    }
  }
  bVar2 = waitForFences(&vk->super_DeviceInterface,
                        (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                        super_RefBase<vk::VkDevice_s_*>.m_data.object,&bindSparseFences);
  if (bVar2) {
    bVar2 = waitForFences(&vk->super_DeviceInterface,
                          (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                          super_RefBase<vk::VkDevice_s_*>.m_data.object,&regularFences);
    if (bVar2) {
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
      ::~vector(&bindSparseFences);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
      ::~vector(&regularFences);
      VVar3 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[4])
                        (vk,(this->super_SparseResourcesBaseInstance).m_logicalDevice.
                            super_RefBase<vk::VkDevice_s_*>.m_data.object);
      ::vk::checkResult(VVar3,"vk.deviceWaitIdle(getDevice())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesQueueBindSparseTests.cpp"
                        ,0x130);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&requirements,"Pass",(allocator<char> *)&regularFences);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&requirements);
      std::__cxx11::string::~string((string *)&requirements);
      goto LAB_006e0adf;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&requirements,
               "Some fences weren\'t signaled (vkQueueBindSparse didn\'t signal semaphores?)",
               &local_2a1);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&requirements);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&requirements,"vkQueueBindSparse didn\'t signal the fence",&local_2a1);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&requirements);
  }
  std::__cxx11::string::~string((string *)&requirements);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ::~vector(&bindSparseFences);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  ::~vector(&regularFences);
LAB_006e0adf:
  std::
  vector<vkt::sparse::(anonymous_namespace)::QueueSubmission,_std::allocator<vkt::sparse::(anonymous_namespace)::QueueSubmission>_>
  ::~vector(&queueSubmissions);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&signalSemaphoresWaitDstStageMask.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
  ::~_Vector_base(&signalSemaphores.
                   super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                 );
  std::_Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
  ::~_Vector_base(&waitSemaphores.
                   super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                 );
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  ::~vector(&allSemaphores);
  std::_Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>::
  ~_Vector_base(&otherQueues.
                 super__Vector_base<const_vkt::sparse::Queue_*,_std::allocator<const_vkt::sparse::Queue_*>_>
               );
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const InstanceInterface&	vki				= m_context.getInstanceInterface();
		const VkPhysicalDevice		physDevice		= m_context.getPhysicalDevice();
		const Queue*				sparseQueue		= DE_NULL;
		std::vector<const Queue*>	otherQueues;

		if (!getPhysicalDeviceFeatures(vki, physDevice).sparseBinding)
			TCU_THROW(NotSupportedError, "Sparse binding not supported");

		// Determine required queues and create a device that supports them
		{
			QueueRequirementsVec requirements;
			requirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
			requirements.push_back(QueueRequirements((VkQueueFlags)0, m_params.numQueues));		// any queue flags

			createDeviceSupportingQueues(requirements);

			sparseQueue = &getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0u);

			// We probably have picked the sparse queue again, so filter it out
			for (deUint32 queueNdx = 0u; queueNdx < m_params.numQueues; ++queueNdx)
			{
				const Queue* queue = &getQueue((VkQueueFlags)0, queueNdx);
				if (queue->queueHandle != sparseQueue->queueHandle)
					otherQueues.push_back(queue);
			}
		}

		const DeviceInterface&				vk = getDeviceInterface();

		std::vector<SemaphoreSp>			allSemaphores;
		std::vector<VkSemaphore>			waitSemaphores;
		std::vector<VkSemaphore>			signalSemaphores;
		std::vector<VkPipelineStageFlags>	signalSemaphoresWaitDstStageMask;
		std::vector<QueueSubmission>		queueSubmissions;

		for (deUint32 i = 0; i < m_params.numWaitSemaphores; ++i)
		{
			allSemaphores.push_back(makeVkSharedPtr(createSemaphore(vk, getDevice())));
			waitSemaphores.push_back(**allSemaphores.back());
		}

		for (deUint32 i = 0; i < m_params.numSignalSemaphores; ++i)
		{
			allSemaphores.push_back(makeVkSharedPtr(createSemaphore(vk, getDevice())));
			signalSemaphores.push_back(**allSemaphores.back());
			signalSemaphoresWaitDstStageMask.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
		}

		// Prepare submissions: signal semaphores for the sparse bind operation
		{
			deUint32 numQueues		= 1u + static_cast<deUint32>(otherQueues.size());
			deUint32 numSemaphores	= m_params.numWaitSemaphores;

			while (numSemaphores > 0u && numQueues > 0u)
			{
				if (numQueues == 1u)	// sparse queue is assigned last
				{
					// sparse queue can handle regular submissions as well
					queueSubmissions.push_back(makeSubmissionRegular(
						sparseQueue, 0u, DE_NULL, DE_NULL, numSemaphores, getDataOrNullptr(waitSemaphores)));
					numSemaphores	= 0u;
					numQueues		= 0u;
				}
				else
				{
					queueSubmissions.push_back(makeSubmissionRegular(
						otherQueues[numQueues - 2], 0u, DE_NULL, DE_NULL, 1u, getDataOrNullptr(waitSemaphores, numSemaphores - 1)));
					--numQueues;
					--numSemaphores;
				}
			}
		}

		// Prepare submission: bind sparse
		if (!m_params.emptySubmission)
		{
			queueSubmissions.push_back(makeSubmissionSparse(
				sparseQueue, m_params.numWaitSemaphores, getDataOrNullptr(waitSemaphores), m_params.numSignalSemaphores, getDataOrNullptr(signalSemaphores)));
		}
		else
		{
			// a dummy submission, won't be used in a call to vkQueueBindSparse
			queueSubmissions.push_back(makeSubmissionSparse(sparseQueue, 0u, DE_NULL, 0u, DE_NULL));
		}

		// Prepare submissions: wait on semaphores signaled by the sparse bind operation
		if (!m_params.emptySubmission)
		{
			deUint32 numQueues		= 1u + static_cast<deUint32>(otherQueues.size());
			deUint32 numSemaphores	= m_params.numSignalSemaphores;

			while (numSemaphores > 0u && numQueues > 0u)
			{
				if (numQueues == 1u)
				{
					queueSubmissions.push_back(makeSubmissionRegular(
						sparseQueue, numSemaphores, getDataOrNullptr(signalSemaphores), getDataOrNullptr(signalSemaphoresWaitDstStageMask), 0u, DE_NULL));
					numSemaphores	= 0u;
					numQueues		= 0u;
				}
				else
				{
					queueSubmissions.push_back(makeSubmissionRegular(
						otherQueues[numQueues - 2], 1u, getDataOrNullptr(signalSemaphores, numSemaphores - 1), getDataOrNullptr(signalSemaphoresWaitDstStageMask, numSemaphores - 1), 0u, DE_NULL));
					--numQueues;
					--numSemaphores;
				}
			}
		}

		// Submit to queues
		{
			std::vector<FenceSp>	regularFences;
			std::vector<FenceSp>	bindSparseFences;

			for (std::vector<QueueSubmission>::const_iterator submissionIter = queueSubmissions.begin(); submissionIter != queueSubmissions.end(); ++submissionIter)
			{
				if (submissionIter->isSparseBinding)
				{
					VkFence fence = DE_NULL;

					if (m_params.bindSparseUseFence)
					{
						bindSparseFences.push_back(makeVkSharedPtr(createFence(vk, getDevice())));
						fence = **bindSparseFences.back();
					}

					if (m_params.emptySubmission)
						VK_CHECK(vk.queueBindSparse(submissionIter->queue->queueHandle, 0u, DE_NULL, fence));
					else
						VK_CHECK(vk.queueBindSparse(submissionIter->queue->queueHandle, 1u, &submissionIter->info.sparse, fence));
				}
				else
				{
					regularFences.push_back(makeVkSharedPtr(createFence(vk, getDevice())));
					VK_CHECK(vk.queueSubmit(submissionIter->queue->queueHandle, 1u, &submissionIter->info.regular, **regularFences.back()));
				}
			}

			if (!waitForFences(vk, getDevice(), bindSparseFences))
				return tcu::TestStatus::fail("vkQueueBindSparse didn't signal the fence");

			if (!waitForFences(vk, getDevice(), regularFences))
				return tcu::TestStatus::fail("Some fences weren't signaled (vkQueueBindSparse didn't signal semaphores?)");
		}

		// May return an error if some waitSemaphores didn't get signaled
		VK_CHECK(vk.deviceWaitIdle(getDevice()));

		return tcu::TestStatus::pass("Pass");
	}